

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  ostream *this_00;
  char *pcVar5;
  ulong uVar6;
  ulonglong uVar7;
  size_type sVar8;
  reference ppcVar9;
  long lVar10;
  double dVar11;
  float local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  undefined1 local_4b0 [8];
  string cpuflags;
  string local_470;
  undefined1 local_450 [8];
  string cacheSize;
  size_t index;
  char *local_420;
  char *local_418;
  undefined1 local_410 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  undefined1 local_358 [8];
  string cpurev;
  undefined1 local_318 [8];
  string cpuname;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  undefined1 local_218 [8];
  string familyStr;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  string CPUSpeed;
  string local_158;
  int local_134;
  undefined1 local_130 [4];
  int numberOfCoresPerCPU;
  undefined1 local_110 [8];
  string cores;
  string local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int id;
  undefined1 local_88 [8];
  string idc;
  long lStack_60;
  int maxId;
  size_t pos;
  size_t fileSize;
  FILE *fd;
  string buffer;
  SystemInformationImplementation *this_local;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&fd);
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    while (iVar3 = feof(__stream), iVar3 == 0) {
      iVar3 = fgetc(__stream);
      std::__cxx11::string::operator+=((string *)&fd,(char)iVar3);
    }
    fclose(__stream);
    std::__cxx11::string::resize((ulong)&fd);
    lStack_60 = std::__cxx11::string::find((char *)&fd,0x8eb75b);
    while (lStack_60 != -1) {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lStack_60 = std::__cxx11::string::find((char *)&fd,0x8eb75b);
    }
    idc.field_2._12_4_ = 0xffffffff;
    std::__cxx11::string::string((string *)local_a8,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_88,this,(string *)local_a8,"physical id",0);
    std::__cxx11::string::~string((string *)local_a8);
    while (this->CurrentPositionInFile != 0xffffffffffffffff) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_ac = atoi(pcVar5);
      if ((int)idc.field_2._12_4_ < local_ac) {
        idc.field_2._12_4_ = local_ac;
      }
      std::__cxx11::string::string((string *)(cores.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_d0,this,(string *)((long)&cores.field_2 + 8),"physical id",
                 this->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)(cores.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)local_130,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_110,this,(string *)local_130,"cpu cores",0);
    std::__cxx11::string::~string((string *)local_130);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    local_134 = atoi(pcVar5);
    if ((int)idc.field_2._12_4_ < 1) {
      std::__cxx11::string::string((string *)(CPUSpeed.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_158,this,(string *)((long)&CPUSpeed.field_2 + 8),"ncpus active",0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      uVar4 = atoi(pcVar5);
      this->NumberOfPhysicalCPU = uVar4;
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)(CPUSpeed.field_2._M_local_buf + 8));
    }
    else {
      this->NumberOfPhysicalCPU = local_134 * (idc.field_2._12_4_ + 1);
    }
    if (this->NumberOfPhysicalCPU == 0) {
      this->NumberOfPhysicalCPU = 1;
    }
    (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
         this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;
    std::__cxx11::string::string((string *)&local_1b8,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_198,this,&local_1b8,"cpu MHz",0);
    std::__cxx11::string::~string((string *)&local_1b8);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      dVar11 = atof(pcVar5);
      this->CPUSpeedInMHz = (float)dVar11;
    }
    else {
      std::__cxx11::string::string((string *)(familyStr.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_1d8,this,(string *)((long)&familyStr.field_2 + 8),"Cpu0ClkTck",0);
      std::__cxx11::string::operator=((string *)local_198,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)(familyStr.field_2._M_local_buf + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      uVar7 = strtoull(pcVar5,(char **)0x0,0x10);
      local_530 = (float)uVar7;
      this->CPUSpeedInMHz = local_530 / 1e+06;
    }
    std::__cxx11::string::string((string *)&local_238,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_218,this,&local_238,"cpu family",0);
    std::__cxx11::string::~string((string *)&local_238);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_278,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_258,this,&local_278,"CPU architecture",0);
      std::__cxx11::string::operator=((string *)local_218,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar5);
    (this->ChipID).Family = iVar3;
    std::__cxx11::string::string((string *)&local_2b8,(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_298,this,&local_2b8,"vendor_id",0);
    std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    FindManufacturer(this,(string *)local_218);
    if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_218,"PA-RISC 1.1a");
      if (bVar2) {
        (this->ChipID).Family = 0x11a;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_218,"PA-RISC 2.0");
        if (bVar2) {
          (this->ChipID).Family = 0x200;
        }
      }
    }
    std::__cxx11::string::string((string *)(cpuname.field_2._M_local_buf + 8),(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_2d8,this,(string *)((long)&cpuname.field_2 + 8),"model",0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar5);
    (this->ChipID).Model = iVar3;
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)(cpuname.field_2._M_local_buf + 8));
    bVar2 = RetrieveClassicalCPUIdentity(this);
    if (!bVar2) {
      std::__cxx11::string::string((string *)(cpurev.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                ((string *)local_318,this,(string *)((long)&cpurev.field_2 + 8),"cpu",0);
      std::__cxx11::string::~string((string *)(cpurev.field_2._M_local_buf + 8));
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&(this->ChipID).ProcessorName,(string *)local_318)
        ;
      }
      std::__cxx11::string::~string((string *)local_318);
    }
    std::__cxx11::string::string((string *)&local_378,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_358,this,&local_378,"stepping",0);
    std::__cxx11::string::~string((string *)&local_378);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_3b8,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_398,this,&local_3b8,"CPU revision",0);
      std::__cxx11::string::operator=((string *)local_358,(string *)&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar5);
    (this->ChipID).Revision = iVar3;
    std::__cxx11::string::string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&fd);
    ExtractValueFromCpuInfoFile
              (&local_3d8,this,
               (string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"model name",0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,pcVar5);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410);
    local_418 = "cache size";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410,&local_418);
    local_420 = "I-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410,&local_420);
    index = (size_t)anon_var_dwarf_677ba4;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410,(value_type *)&index
              );
    (this->Features).L1CacheSize = 0;
    for (cacheSize.field_2._8_8_ = 0; uVar1 = cacheSize.field_2._8_8_,
        sVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410),
        (ulong)uVar1 < sVar8; cacheSize.field_2._8_8_ = cacheSize.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)&local_470,(string *)&fd);
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410,
                           cacheSize.field_2._8_8_);
      ExtractValueFromCpuInfoFile((string *)local_450,this,&local_470,*ppcVar9,0);
      std::__cxx11::string::~string((string *)&local_470);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        lVar10 = std::__cxx11::string::find(local_450,0x8eb821);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)((long)&cpuflags.field_2 + 8),(ulong)local_450);
          std::__cxx11::string::operator=
                    ((string *)local_450,(string *)(cpuflags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(cpuflags.field_2._M_local_buf + 8));
        }
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iVar3 = atoi(pcVar5);
        (this->Features).L1CacheSize = iVar3 + (this->Features).L1CacheSize;
      }
      std::__cxx11::string::~string((string *)local_450);
    }
    std::__cxx11::string::string((string *)&local_4d0,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_4b0,this,&local_4d0,"flags",0);
    std::__cxx11::string::~string((string *)&local_4d0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_510," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0)
      ;
      std::operator+(&local_4f0,&local_510," ");
      std::__cxx11::string::operator=((string *)local_4b0,(string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_510);
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb825);
      if (lVar10 != -1) {
        (this->Features).HasFPU = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb82b);
      if (lVar10 != -1) {
        (this->Features).HasTSC = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb831);
      if (lVar10 != -1) {
        (this->Features).HasMMX = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb837);
      if (lVar10 != -1) {
        (this->Features).HasSSE = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb83d);
      if (lVar10 != -1) {
        (this->Features).HasSSE2 = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb844);
      if (lVar10 != -1) {
        (this->Features).HasAPIC = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb84b);
      if (lVar10 != -1) {
        (this->Features).HasCMOV = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb852);
      if (lVar10 != -1) {
        (this->Features).HasMTRR = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb859);
      if (lVar10 != -1) {
        (this->Features).HasACPI = true;
      }
      lVar10 = std::__cxx11::string::find(local_4b0,0x8eb860);
      if (lVar10 != -1) {
        (this->Features).ExtendedFeatures.Has3DNow = true;
      }
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_4b0);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_410);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::~string((string *)&fd);
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  kwsys_stl::string buffer;

  FILE *fd = fopen("/proc/cpuinfo", "r" );
  if ( !fd )
    {
    kwsys_ios::cout << "Problem opening /proc/cpuinfo" << kwsys_ios::endl;
    return false;
    }

  size_t fileSize = 0;
  while(!feof(fd))
    {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
    }
  fclose( fd );
  buffer.resize(fileSize-2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and hyperthreading)
  size_t pos = buffer.find("processor\t");
  while(pos != buffer.npos)
    {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t",pos+1);
    }

#ifdef __linux
  // Find the largest physical id.
  int maxId = -1;
  kwsys_stl::string idc =
                       this->ExtractValueFromCpuInfoFile(buffer,"physical id");
  while(this->CurrentPositionInFile != buffer.npos)
    {
      int id = atoi(idc.c_str());
      if(id > maxId)
      {
       maxId=id;
      }
    idc = this->ExtractValueFromCpuInfoFile(buffer,"physical id",
                                            this->CurrentPositionInFile+1);
    }
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  kwsys_stl::string cores =
                        this->ExtractValueFromCpuInfoFile(buffer,"cpu cores");
  int numberOfCoresPerCPU=atoi(cores.c_str());
  if (maxId > 0)
    {
    this->NumberOfPhysicalCPU=static_cast<unsigned int>(
      numberOfCoresPerCPU*(maxId+1));
    }
  else
    {
    // Linux Sparc: get cpu count
    this->NumberOfPhysicalCPU=
            atoi(this->ExtractValueFromCpuInfoFile(buffer,"ncpus active").c_str());
    }

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  kwsys_stl::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu count");
  this->NumberOfPhysicalCPU=
    this->NumberOfLogicalCPU = atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if(this->NumberOfPhysicalCPU <= 0)
    {
    this->NumberOfPhysicalCPU = 1;
    }
  // LogicalProcessorsPerPhysical>1 => hyperthreading.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical=
      this->NumberOfLogicalCPU/this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  kwsys_stl::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"cpu MHz");
  if(!CPUSpeed.empty())
    {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
    }
#ifdef __linux
  else
    {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"Cpu0ClkTck");
    this->CPUSpeedInMHz = static_cast<float>(
                                 strtoull(CPUSpeed.c_str(),0,16))/1000000.0f;
    }
#endif

  // Chip family
  kwsys_stl::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu family");
  if(familyStr.empty())
    {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer,"CPU architecture");
    }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer,"vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP)
    {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
    }

  // Chip Model
  this->ChipID.Model = atoi(this->ExtractValueFromCpuInfoFile(buffer,"model").c_str());
  if(!this->RetrieveClassicalCPUIdentity())
    {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    kwsys_stl::string cpuname = this->ExtractValueFromCpuInfoFile(buffer,"cpu");
    if(!cpuname.empty())
      {
      this->ChipID.ProcessorName = cpuname;
      }
    }

  // Chip revision
  kwsys_stl::string cpurev = this->ExtractValueFromCpuInfoFile(buffer,"stepping");
  if(cpurev.empty())
    {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer,"CPU revision");
    }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName = this->ExtractValueFromCpuInfoFile(buffer,"model name").c_str();

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  kwsys_stl::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache"); // e.g. PA-RISC
  cachename.push_back("D-cache"); // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index ++)
    {
    kwsys_stl::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer,cachename[index]);
    if (!cacheSize.empty())
      {
      pos = cacheSize.find(" KB");
      if(pos!=cacheSize.npos)
        {
        cacheSize = cacheSize.substr(0,pos);
        }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
      }
    }

  // processor feature flags (probably x86 specific)
  kwsys_stl::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer,"flags");
  if(!cpurev.empty())
    {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ")!=kwsys_stl::string::npos))
      {
      this->Features.HasFPU = true;
      }
    if ((cpuflags.find(" tsc ")!=kwsys_stl::string::npos))
      {
      this->Features.HasTSC = true;
      }
    if ((cpuflags.find(" mmx ")!=kwsys_stl::string::npos))
      {
      this->Features.HasMMX = true;
      }
    if ((cpuflags.find(" sse ")!=kwsys_stl::string::npos))
      {
      this->Features.HasSSE = true;
      }
    if ((cpuflags.find(" sse2 ")!=kwsys_stl::string::npos))
      {
      this->Features.HasSSE2 = true;
      }
    if ((cpuflags.find(" apic ")!=kwsys_stl::string::npos))
      {
      this->Features.HasAPIC = true;
      }
    if ((cpuflags.find(" cmov ")!=kwsys_stl::string::npos))
      {
      this->Features.HasCMOV = true;
      }
    if ((cpuflags.find(" mtrr ")!=kwsys_stl::string::npos))
      {
      this->Features.HasMTRR = true;
      }
    if ((cpuflags.find(" acpi ")!=kwsys_stl::string::npos))
      {
      this->Features.HasACPI = true;
      }
    if ((cpuflags.find(" 3dnow ")!=kwsys_stl::string::npos))
      {
      this->Features.ExtendedFeatures.Has3DNow = true;
      }
    }

  return true;
}